

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DecoratorText.cpp
# Opt level: O0

void __thiscall
Rml::DecoratorText::RenderElement
          (DecoratorText *this,Element *element,DecoratorDataHandle element_data)

{
  Texture texture;
  ulong uVar1;
  bool bVar2;
  size_type sVar3;
  reference this_00;
  reference pvVar4;
  CompiledShader local_68;
  RenderManager *local_58;
  undefined8 uStack_50;
  Vector2f local_40;
  ulong local_38;
  size_t i;
  Vector2f translation;
  ElementData *data;
  DecoratorDataHandle element_data_local;
  Element *element_local;
  DecoratorText *this_local;
  
  translation = (Vector2f)element_data;
  bVar2 = GenerateGeometry(this,element,(ElementData *)element_data);
  if (bVar2) {
    i = (size_t)Element::GetAbsoluteOffset(element,Border);
    for (local_38 = 0; uVar1 = local_38,
        sVar3 = ::std::
                vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                ::size((vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                        *)((long)translation + 8)), uVar1 < sVar3; local_38 = local_38 + 1) {
      this_00 = ::std::
                vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                ::operator[]((vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                              *)((long)translation + 8),local_38);
      local_40.x = (float)(undefined4)i;
      local_40.y = (float)i._4_4_;
      pvVar4 = ::std::
               vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
               ::operator[]((vector<Rml::DecoratorText::TexturedGeometry,_std::allocator<Rml::DecoratorText::TexturedGeometry>_>
                             *)((long)translation + 8),local_38);
      local_58 = (pvVar4->texture).render_manager;
      uStack_50._0_4_ = (pvVar4->texture).file_index;
      uStack_50._4_4_ = (pvVar4->texture).callback_index;
      local_68.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.render_manager =
           (RenderManager *)0x0;
      local_68.super_UniqueRenderResource<Rml::CompiledShader,_unsigned_long,_0UL>.resource_handle =
           0;
      CompiledShader::CompiledShader(&local_68);
      texture.file_index = (undefined4)uStack_50;
      texture.callback_index = uStack_50._4_4_;
      texture.render_manager = local_58;
      Geometry::Render(&this_00->geometry,local_40,texture,&local_68);
      CompiledShader::~CompiledShader(&local_68);
    }
  }
  return;
}

Assistant:

void DecoratorText::RenderElement(Element* element, DecoratorDataHandle element_data) const
{
	ElementData* data = reinterpret_cast<ElementData*>(element_data);
	if (!GenerateGeometry(element, *data))
		return;

	const Vector2f translation = element->GetAbsoluteOffset(BoxArea::Border);

	for (size_t i = 0; i < data->textured_geometry.size(); ++i)
		data->textured_geometry[i].geometry.Render(translation, data->textured_geometry[i].texture);
}